

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TestOutput_PrintInVisualStudioFormat_Test::TEST_TestOutput_PrintInVisualStudioFormat_Test
          (TEST_TestOutput_PrintInVisualStudioFormat_Test *this)

{
  TEST_TestOutput_PrintInVisualStudioFormat_Test *this_local;
  
  memset(this,0,0x40);
  TEST_GROUP_CppUTestGroupTestOutput::TEST_GROUP_CppUTestGroupTestOutput
            (&this->super_TEST_GROUP_CppUTestGroupTestOutput);
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_TestOutput_PrintInVisualStudioFormat_Test_003f99c0;
  return;
}

Assistant:

TEST(TestOutput, PrintInVisualStudioFormat)
{
    TestOutput::setWorkingEnvironment(TestOutput::visualStudio);
    printer->printFailure(*f3);
    const char* expected =
            "\nfile(10): error: Failure in TEST(group, test)"
            "\nfile(2): error:\n\tmessage\n\n";
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}